

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  xml_node_struct *in_RAX;
  void *pvVar4;
  void *pvVar5;
  xml_attribute xVar6;
  xml_attribute xVar7;
  xml_node_struct *rn;
  xml_node_struct *ln;
  xml_attribute xVar8;
  xml_attribute local_28;
  
  local_28._attr = (xml_attribute_struct *)in_RAX;
  pvVar4 = document_buffer_order((xpath_node *)this);
  pvVar5 = document_buffer_order(lhs);
  if (pvVar5 != (void *)0x0 && pvVar4 != (void *)0x0) {
    return pvVar4 < pvVar5;
  }
  if (*(long *)(this + 8) == 0) {
    xVar8._attr = *(xml_attribute_struct **)this;
  }
  else {
    xml_node::xml_node((xml_node *)&local_28);
    xVar8._attr = local_28._attr;
  }
  if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) {
    xVar7._attr = (xml_attribute_struct *)(lhs->_node)._root;
  }
  else {
    xml_node::xml_node((xml_node *)&local_28);
    xVar7._attr = local_28._attr;
  }
  xVar6._attr = *(xml_attribute_struct **)(this + 8);
  pxVar1 = (xml_node_struct *)(lhs->_attribute)._attr;
  if ((xml_node_struct *)xVar6._attr == (xml_node_struct *)0x0) {
    if ((pxVar1 != (xml_node_struct *)0x0) &&
       (xVar7._attr = (xml_attribute_struct *)(lhs->_node)._root,
       (xml_node_struct *)xVar7._attr == *(xml_node_struct **)this)) {
      return true;
    }
  }
  else {
    xVar8._attr = *(xml_attribute_struct **)this;
    if (pxVar1 == (xml_node_struct *)0x0) {
      if ((xml_node_struct *)xVar8._attr == (lhs->_node)._root) {
        return false;
      }
    }
    else {
      xVar7._attr = (xml_attribute_struct *)(lhs->_node)._root;
      if (xVar8._attr == xVar7._attr) {
        if ((xml_node_struct *)xVar6._attr == pxVar1) {
          return true;
        }
        do {
          xml_attribute::xml_attribute
                    (&local_28,(xml_attribute_struct *)((xml_node_struct *)xVar6._attr)->first_child
                    );
          if ((xml_node_struct *)local_28._attr == (xml_node_struct *)0x0) break;
          xVar6._attr = local_28._attr;
        } while ((xml_node_struct *)local_28._attr != (xml_node_struct *)(lhs->_attribute)._attr);
        return (xml_node_struct *)local_28._attr != (xml_node_struct *)0x0;
      }
    }
  }
  if (xVar8._attr == xVar7._attr) {
    return false;
  }
  if (((xml_node_struct *)xVar7._attr == (xml_node_struct *)0x0) ||
     (pxVar1 = (xml_node_struct *)xVar8._attr, pxVar2 = (xml_node_struct *)xVar7._attr,
     (xml_node_struct *)xVar8._attr == (xml_node_struct *)0x0)) {
    return xVar8._attr < xVar7._attr;
  }
  while ((rn = pxVar2, ln = pxVar1, ln != (xml_node_struct *)0x0 && (rn != (xml_node_struct *)0x0)))
  {
    pxVar1 = ln->parent;
    pxVar2 = rn->parent;
    if (ln->parent == rn->parent) goto LAB_00188099;
  }
  bVar3 = ln == (xml_node_struct *)0x0;
  if (!bVar3) {
    do {
      ln = ln->parent;
      xVar8._attr = (xml_attribute_struct *)((xml_node_struct *)xVar8._attr)->parent;
    } while (ln != (xml_node_struct *)0x0);
  }
  for (; rn != (xml_node_struct *)0x0; rn = rn->parent) {
    xVar7._attr = (xml_attribute_struct *)((xml_node_struct *)xVar7._attr)->parent;
  }
  if (xVar8._attr == xVar7._attr) {
    return bVar3;
  }
  do {
    ln = (xml_node_struct *)xVar8._attr;
    rn = (xml_node_struct *)xVar7._attr;
    xVar7._attr = (xml_attribute_struct *)rn->parent;
    xVar8._attr = (xml_attribute_struct *)ln->parent;
  } while (ln->parent != rn->parent);
LAB_00188099:
  bVar3 = node_is_before_sibling(ln,rn);
  return bVar3;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}